

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS
ref_part_meshb_geom_bcast
          (REF_GEOM ref_geom,REF_LONG ngeom,REF_INT type,REF_NODE ref_node,REF_INT version,
          FILE *file)

{
  uint uVar1;
  size_t sVar2;
  int local_f4;
  long local_f0;
  int local_e8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT local;
  REF_INT i;
  REF_INT new_geom;
  REF_INT geom;
  REF_INT section_size;
  REF_LONG ngeom_read;
  REF_DBL double_gref;
  REF_DBL *read_param;
  REF_LONG *read_gref;
  REF_LONG *read_id;
  REF_LONG *read_node;
  REF_MPI pRStack_48;
  REF_INT chunk;
  REF_MPI ref_mpi;
  FILE *file_local;
  REF_NODE pRStack_30;
  REF_INT version_local;
  REF_NODE ref_node_local;
  REF_LONG RStack_20;
  REF_INT type_local;
  REF_LONG ngeom_local;
  REF_GEOM ref_geom_local;
  
  pRStack_48 = ref_node->ref_mpi;
  if (ngeom / (long)pRStack_48->n < 1000000) {
    local_e8 = 1000000;
  }
  else {
    local_e8 = (int)(ngeom / (long)pRStack_48->n);
  }
  local_f0 = ngeom;
  if (local_e8 < ngeom) {
    local_f0 = (long)local_e8;
  }
  read_node._4_4_ = (int)local_f0;
  ref_mpi = (REF_MPI)file;
  file_local._4_4_ = version;
  pRStack_30 = ref_node;
  ref_node_local._4_4_ = type;
  RStack_20 = ngeom;
  ngeom_local = (REF_LONG)ref_geom;
  if (read_node._4_4_ < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x160,
           "ref_part_meshb_geom_bcast","malloc read_node of REF_LONG negative");
    ref_geom_local._4_4_ = 1;
  }
  else {
    read_id = (REF_LONG *)malloc((long)read_node._4_4_ << 3);
    if (read_id == (REF_LONG *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x160,
             "ref_part_meshb_geom_bcast","malloc read_node of REF_LONG NULL");
      ref_geom_local._4_4_ = 2;
    }
    else if (read_node._4_4_ < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x161,
             "ref_part_meshb_geom_bcast","malloc read_id of REF_LONG negative");
      ref_geom_local._4_4_ = 1;
    }
    else {
      read_gref = (REF_LONG *)malloc((long)read_node._4_4_ << 3);
      if (read_gref == (REF_LONG *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x161,"ref_part_meshb_geom_bcast","malloc read_id of REF_LONG NULL");
        ref_geom_local._4_4_ = 2;
      }
      else if (read_node._4_4_ < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x162,"ref_part_meshb_geom_bcast","malloc read_gref of REF_LONG negative");
        ref_geom_local._4_4_ = 1;
      }
      else {
        read_param = (REF_DBL *)malloc((long)read_node._4_4_ << 3);
        if (read_param == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x162,"ref_part_meshb_geom_bcast","malloc read_gref of REF_LONG NULL");
          ref_geom_local._4_4_ = 2;
        }
        else if (read_node._4_4_ * 2 < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x163,"ref_part_meshb_geom_bcast","malloc read_param of REF_DBL negative");
          ref_geom_local._4_4_ = 1;
        }
        else {
          double_gref = (REF_DBL)malloc((long)(read_node._4_4_ << 1) << 3);
          if ((void *)double_gref == (void *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x163,"ref_part_meshb_geom_bcast","malloc read_param of REF_DBL NULL");
            ref_geom_local._4_4_ = 2;
          }
          else {
            for (_geom = 0; _geom < RStack_20; _geom = new_geom + _geom) {
              if (read_node._4_4_ < (int)RStack_20 - (int)_geom) {
                local_f4 = read_node._4_4_;
              }
              else {
                local_f4 = (int)RStack_20 - (int)_geom;
              }
              new_geom = local_f4;
              if (pRStack_48->id == 0) {
                for (i = 0; i < new_geom; i = i + 1) {
                  uVar1 = ref_part_meshb_long((FILE *)ref_mpi,file_local._4_4_,read_id + i);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x16a,"ref_part_meshb_geom_bcast",(ulong)uVar1,"node");
                    return uVar1;
                  }
                  uVar1 = ref_part_meshb_long((FILE *)ref_mpi,file_local._4_4_,read_gref + i);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x16b,"ref_part_meshb_geom_bcast",(ulong)uVar1,"node");
                    return uVar1;
                  }
                  for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 2;
                      ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                    *(undefined8 *)
                     ((long)double_gref + (long)(ref_private_macro_code_rss + i * 2) * 8) = 0;
                  }
                  for (ref_private_macro_code_rss = 0;
                      ref_private_macro_code_rss < ref_node_local._4_4_;
                      ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                    sVar2 = fread((void *)((long)double_gref +
                                          (long)(ref_private_macro_code_rss + i * 2) * 8),8,1,
                                  (FILE *)ref_mpi);
                    if (sVar2 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x170,"ref_part_meshb_geom_bcast","param",1,sVar2);
                      return 1;
                    }
                  }
                  read_param[i] = (REF_DBL)read_gref[i];
                  if (0 < ref_node_local._4_4_) {
                    sVar2 = fread(&ngeom_read,8,1,(FILE *)ref_mpi);
                    if (sVar2 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x173,"ref_part_meshb_geom_bcast","gref",1,sVar2);
                      return 1;
                    }
                    read_param[i] = (REF_DBL)(long)(double)ngeom_read;
                  }
                }
                for (i = 0; i < new_geom; i = i + 1) {
                  read_id[i] = read_id[i] + -1;
                }
              }
              uVar1 = ref_mpi_bcast(pRStack_48,read_id,new_geom,2);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x179,"ref_part_meshb_geom_bcast",(ulong)uVar1,"nd");
                return uVar1;
              }
              uVar1 = ref_mpi_bcast(pRStack_48,read_gref,new_geom,2);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x17a,"ref_part_meshb_geom_bcast",(ulong)uVar1,"id");
                return uVar1;
              }
              uVar1 = ref_mpi_bcast(pRStack_48,read_param,new_geom,2);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x17b,"ref_part_meshb_geom_bcast",(ulong)uVar1,"gref");
                return uVar1;
              }
              uVar1 = ref_mpi_bcast(pRStack_48,(void *)double_gref,new_geom << 1,3);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x17d,"ref_part_meshb_geom_bcast",(ulong)uVar1,"pm");
                return uVar1;
              }
              for (i = 0; i < new_geom; i = i + 1) {
                uVar1 = ::ref_node_local(pRStack_30,read_id[i],&ref_private_macro_code_rss_1);
                if ((uVar1 != 0) && (uVar1 != 5)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x180,"ref_part_meshb_geom_bcast",(ulong)uVar1,"local");
                  return uVar1;
                }
                if (ref_private_macro_code_rss_1 != -1) {
                  uVar1 = ref_geom_add((REF_GEOM)ngeom_local,ref_private_macro_code_rss_1,
                                       ref_node_local._4_4_,(REF_INT)read_gref[i],
                                       (REF_DBL *)((long)double_gref + (long)(i << 1) * 8));
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x184,"ref_part_meshb_geom_bcast",(ulong)uVar1,"add geom");
                    return uVar1;
                  }
                  uVar1 = ref_geom_find((REF_GEOM)ngeom_local,ref_private_macro_code_rss_1,
                                        ref_node_local._4_4_,(REF_INT)read_gref[i],&local);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x187,"ref_part_meshb_geom_bcast",(ulong)uVar1,"find");
                    return uVar1;
                  }
                  *(int *)(*(long *)(ngeom_local + 0x10) + (long)(local * 6 + 2) * 4) =
                       SUB84(read_param[i],0);
                }
              }
            }
            if (double_gref != 0.0) {
              free((void *)double_gref);
            }
            if (read_param != (REF_DBL *)0x0) {
              free(read_param);
            }
            if (read_gref != (REF_LONG *)0x0) {
              free(read_gref);
            }
            if (read_id != (REF_LONG *)0x0) {
              free(read_id);
            }
            ref_geom_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_part_meshb_geom_bcast(
    REF_GEOM ref_geom, REF_LONG ngeom, REF_INT type, REF_NODE ref_node,
    REF_INT version, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_LONG *read_node;
  REF_LONG *read_id;
  REF_LONG *read_gref;
  REF_DBL *read_param;
  REF_DBL double_gref;

  REF_LONG ngeom_read;
  REF_INT section_size;

  REF_INT geom, new_geom;
  REF_INT i, local;

  chunk = (REF_INT)MAX(1000000, ngeom / (REF_LONG)ref_mpi_n(ref_mpi));
  chunk = (REF_INT)MIN((REF_LONG)chunk, ngeom);

  ref_malloc(read_node, chunk, REF_LONG);
  ref_malloc(read_id, chunk, REF_LONG);
  ref_malloc(read_gref, chunk, REF_LONG);
  ref_malloc(read_param, 2 * chunk, REF_DBL);

  ngeom_read = 0;
  while (ngeom_read < ngeom) {
    section_size = MIN(chunk, (REF_INT)(ngeom - ngeom_read));
    if (ref_mpi_once(ref_mpi)) {
      for (geom = 0; geom < section_size; geom++) {
        RSS(ref_part_meshb_long(file, version, &(read_node[geom])), "node");
        RSS(ref_part_meshb_long(file, version, &(read_id[geom])), "node");
        for (i = 0; i < 2; i++)
          read_param[i + 2 * geom] = 0.0; /* ensure init */
        for (i = 0; i < type; i++)
          REIS(1, fread(&(read_param[i + 2 * geom]), sizeof(double), 1, file),
               "param");
        read_gref[geom] = read_id[geom];
        if (0 < type) {
          REIS(1, fread(&(double_gref), sizeof(double), 1, file), "gref");
          read_gref[geom] = (REF_LONG)double_gref;
        }
      }
      for (geom = 0; geom < section_size; geom++) read_node[geom]--;
    }
    RSS(ref_mpi_bcast(ref_mpi, read_node, section_size, REF_LONG_TYPE), "nd");
    RSS(ref_mpi_bcast(ref_mpi, read_id, section_size, REF_LONG_TYPE), "id");
    RSS(ref_mpi_bcast(ref_mpi, read_gref, section_size, REF_LONG_TYPE), "gref");
    RSS(ref_mpi_bcast(ref_mpi, read_param, 2 * section_size, REF_DBL_TYPE),
        "pm");
    for (geom = 0; geom < section_size; geom++) {
      RXS(ref_node_local(ref_node, read_node[geom], &local), REF_NOT_FOUND,
          "local");
      if (REF_EMPTY != local) {
        RSS(ref_geom_add(ref_geom, local, type, (REF_INT)read_id[geom],
                         &(read_param[2 * geom])),
            "add geom");
        RSS(ref_geom_find(ref_geom, local, type, (REF_INT)read_id[geom],
                          &new_geom),
            "find");
        ref_geom_gref(ref_geom, new_geom) = (REF_INT)read_gref[geom];
      }
    }
    ngeom_read += section_size;
  }

  ref_free(read_param);
  ref_free(read_gref);
  ref_free(read_id);
  ref_free(read_node);

  return REF_SUCCESS;
}